

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_0::GetEnumValidationRangeSlow
               (EnumDescriptor *enum_type,int16_t *start,uint16_t *size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  reference pvVar6;
  byte bVar7;
  size_t bit_pos;
  uint64_t *v;
  size_t index;
  int local_188;
  int N_1;
  int i_1;
  int unique_count;
  allocator<unsigned_long> local_161;
  undefined1 local_160 [8];
  FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_> array;
  int64_t range;
  int local_40;
  int local_3c;
  int N;
  int i;
  int max;
  int min;
  anon_class_8_1_24043258 val;
  uint16_t *size_local;
  int16_t *start_local;
  EnumDescriptor *enum_type_local;
  
  _max = (EnumDescriptor **)&start_local;
  val.enum_type = (EnumDescriptor **)size;
  start_local = (int16_t *)enum_type;
  N = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()
                ((anon_class_8_1_24043258 *)&max,0);
  local_3c = 1;
  i = N;
  local_40 = EnumDescriptor::value_count((EnumDescriptor *)start_local);
  for (; local_3c < local_40; local_3c = local_3c + 1) {
    range._4_4_ = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()
                            ((anon_class_8_1_24043258 *)&max,local_3c);
    piVar4 = std::min<int>(&i,(int *)((long)&range + 4));
    i = *piVar4;
    range._0_4_ = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()
                            ((anon_class_8_1_24043258 *)&max,local_3c);
    piVar4 = std::max<int>(&N,(int *)&range);
    N = *piVar4;
  }
  array.storage_.data_ = (StorageElement *)(((long)N - (long)i) + 1);
  iVar2 = EnumDescriptor::value_count((EnumDescriptor *)start_local);
  if ((long)iVar2 < (long)array.storage_.data_) {
    enum_type_local._7_1_ = 0;
  }
  else {
    bVar1 = SetEnumValidationRange(i,(int64_t)array.storage_.data_,start,(uint16_t *)val.enum_type);
    if (bVar1) {
      lVar5 = (long)array.storage_.data_ + 0x3f;
      if ((long)array.storage_.data_ + 0x3f < 0) {
        lVar5 = (long)array.storage_.data_ + 0x7e;
      }
      std::allocator<unsigned_long>::allocator(&local_161);
      absl::lts_20240722::
      FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::FixedArray
                ((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                  *)local_160,lVar5 >> 6,&local_161);
      std::allocator<unsigned_long>::~allocator(&local_161);
      _i_1 = 0;
      absl::lts_20240722::
      FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::fill
                ((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                  *)local_160,(value_type *)&i_1);
      N_1 = 0;
      local_188 = 0;
      iVar2 = EnumDescriptor::value_count((EnumDescriptor *)start_local);
      for (; local_188 < iVar2; local_188 = local_188 + 1) {
        iVar3 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()
                          ((anon_class_8_1_24043258 *)&max,local_188);
        iVar3 = iVar3 - i;
        pvVar6 = absl::lts_20240722::
                 FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::
                 operator[]((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                             *)local_160,(ulong)(long)iVar3 >> 6);
        bVar7 = (byte)iVar3 & 0x3f;
        N_1 = (uint)((*pvVar6 & 1L << bVar7) == 0) + N_1;
        *pvVar6 = 1L << bVar7 | *pvVar6;
      }
      enum_type_local._7_1_ = (StorageElement *)(long)N_1 == array.storage_.data_;
      absl::lts_20240722::
      FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::~FixedArray
                ((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                  *)local_160);
    }
    else {
      enum_type_local._7_1_ = 0;
    }
  }
  return (bool)(enum_type_local._7_1_ & 1);
}

Assistant:

bool GetEnumValidationRangeSlow(const EnumDescriptor* enum_type, int16_t& start,
                                uint16_t& size) {
  const auto val = [&](int index) { return enum_type->value(index)->number(); };
  int min = val(0);
  int max = min;

  for (int i = 1, N = static_cast<int>(enum_type->value_count()); i < N; ++i) {
    min = std::min(min, val(i));
    max = std::max(max, val(i));
  }

  // int64 because max-min can overflow int.
  int64_t range = static_cast<int64_t>(max) - static_cast<int64_t>(min) + 1;

  if (enum_type->value_count() < range) {
    // There are not enough values to fill the range. Exit early.
    return false;
  }

  if (!SetEnumValidationRange(min, range, start, size)) {
    // Don't even bother on checking for a dense range if we can't represent the
    // min/max in the output.
    return false;
  }

  absl::FixedArray<uint64_t> array((range + 63) / 64);
  array.fill(0);

  int unique_count = 0;
  for (int i = 0, N = static_cast<int>(enum_type->value_count()); i < N; ++i) {
    size_t index = val(i) - min;
    uint64_t& v = array[index / 64];
    size_t bit_pos = index % 64;
    unique_count += (v & (uint64_t{1} << bit_pos)) == 0;
    v |= uint64_t{1} << bit_pos;
  }

  return unique_count == range;
}